

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printString(JSPrinter *this,Ref node)

{
  Ref *this_00;
  Value *this_01;
  char *s;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,'\"');
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  this_01 = Ref::operator->(this_00);
  s = Value::getCString(this_01);
  emit(this,s);
  emit(this,'\"');
  return;
}

Assistant:

void printString(Ref node) {
    emit('"');
    emit(node[1]->getCString());
    emit('"');
  }